

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

Result * __thiscall
doctest::detail::Expression_lhs::operator_cast_to_Result
          (Result *__return_storage_ptr__,Expression_lhs *this)

{
  byte bVar1;
  ContextOptions *pCVar2;
  byte bVar3;
  String local_30;
  
  bVar1 = **(byte **)this;
  bVar3 = (byte)this[9] ^ bVar1;
  if ((bVar3 & 1) != 0) {
    pCVar2 = getContextOptions();
    if (pCVar2->success != true) {
      String::String(&local_30);
      Result::Result(__return_storage_ptr__,true,&local_30);
      goto LAB_00172448;
    }
    bVar1 = **(byte **)this;
  }
  doctest::toString(&local_30,(bool)(bVar1 & 1));
  Result::Result(__return_storage_ptr__,(bool)(bVar3 & 1),&local_30);
LAB_00172448:
  String::~String(&local_30);
  return __return_storage_ptr__;
}

Assistant:

DOCTEST_NOINLINE operator Result() {
// this is needed only foc MSVC 2015:
// https://ci.appveyor.com/project/onqtam/doctest/builds/38181202
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4800) // 'int': forcing value to bool
            bool res = static_cast<bool>(lhs);
DOCTEST_MSVC_SUPPRESS_WARNING_POP
            if(m_at & assertType::is_false) //!OCLINT bitwise operator in conditional
                res = !res;

            if(!res || getContextOptions()->success)
                return Result(res, toString(lhs));
            return Result(res);
        }